

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::TestRecursion(int size,char *pattern)

{
  size_t sVar1;
  ulong uVar2;
  undefined4 in_register_0000003c;
  string domain;
  RE2 re;
  char *local_138;
  undefined8 local_130;
  char local_128 [16];
  StringPiece local_118;
  char *local_108;
  undefined4 local_100;
  RE2 local_f0;
  
  local_130 = 0;
  local_128[0] = '\0';
  local_138 = local_128;
  std::__cxx11::string::resize((ulong)&local_138,'\0');
  sVar1 = strlen((char *)CONCAT44(in_register_0000003c,size));
  uVar2 = 0;
  do {
    local_138[uVar2] = ((char *)CONCAT44(in_register_0000003c,size))[uVar2 % sVar1];
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x3c00);
  local_118.ptr_ = "([a-zA-Z0-9]|-)+(\\.([a-zA-Z0-9]|-)+)*(\\.)?";
  local_118.length_ = 0x2a;
  RE2::Options::Options((Options *)&local_108,Quiet);
  RE2::RE2(&local_f0,&local_118,(Options *)&local_108);
  local_108 = local_138;
  local_100 = (int)local_130;
  RE2::FullMatchN((StringPiece *)&local_108,&local_f0,(Arg **)0x0,0);
  RE2::~RE2(&local_f0);
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  return;
}

Assistant:

static void TestRecursion(int size, const char* pattern) {
  // Fill up a string repeating the pattern given
  string domain;
  domain.resize(size);
  size_t patlen = strlen(pattern);
  for (int i = 0; i < size; i++) {
    domain[i] = pattern[i % patlen];
  }
  // Just make sure it doesn't crash due to too much recursion.
  RE2 re("([a-zA-Z0-9]|-)+(\\.([a-zA-Z0-9]|-)+)*(\\.)?", RE2::Quiet);
  RE2::FullMatch(domain, re);
}